

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O2

ssize_t __thiscall
kj::GzipAsyncOutputStream::write(GzipAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  undefined4 in_register_00000034;
  GzipAsyncOutputStream *this_01;
  
  handle._M_fr_ptr = operator_new(0x420);
  *(code **)handle._M_fr_ptr = write;
  *(code **)((long)handle._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(size_t *)((long)handle._M_fr_ptr + 0x408) = __n;
  *(void **)((long)handle._M_fr_ptr + 0x400) = __buf;
  *(ulong *)((long)handle._M_fr_ptr + 0x3f8) = CONCAT44(in_register_00000034,__fd);
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
  ;
  location.lineNumber = 0xff;
  location.columnNumber = 0x26;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
  this_01 = (GzipAsyncOutputStream *)((long)handle._M_fr_ptr + 0x3f0);
  while( true ) {
    *(void **)((long)handle._M_fr_ptr + 0x410) = __buf;
    if ((undefined8 *)__buf ==
        (undefined8 *)
        (*(long *)((long)handle._M_fr_ptr + 0x408) * 0x10 +
        *(long *)((long)handle._M_fr_ptr + 0x400))) {
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
      *(undefined8 *)handle._M_fr_ptr = 0;
      *(undefined1 *)((long)handle._M_fr_ptr + 0x418) = 1;
      return (ssize_t)this;
    }
    write(this_01,(int)*(undefined8 *)((long)handle._M_fr_ptr + 0x3f8),*__buf,
          *(size_t *)((long)__buf + 8));
    co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x418) = 0;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar1) break;
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    __buf = (void *)(*(long *)((long)handle._M_fr_ptr + 0x410) + 0x10);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> GzipAsyncOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
  for (auto piece: pieces) co_await write(piece);
}